

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O2

bool xercesc_4_0::XMLUri::isWellFormedAddress(XMLCh *addrString,MemoryManager *manager)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  XMLSize_t length;
  undefined4 extraout_var;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  XMLCh *targetStr;
  
  if ((addrString != (XMLCh *)0x0) && (*addrString != L'\0')) {
    length = XMLString::stringLen(addrString);
    if (1 < (ushort)*addrString - 0x2d) {
      if (*addrString == L'[') {
        bVar1 = isWellFormedIPv6Reference(addrString,length);
        return bVar1;
      }
      if (addrString[length - 1] != L'-') {
        iVar3 = XMLString::lastIndexOf(addrString,L'.');
        if (length == (long)(iVar3 + 1)) {
          iVar4 = (*manager->_vptr_MemoryManager[3])(manager,length * 2);
          targetStr = (XMLCh *)CONCAT44(extraout_var,iVar4);
          XMLString::subString(targetStr,addrString,0,(long)iVar3,manager);
          iVar3 = XMLString::lastIndexOf(targetStr,L'.');
          (*manager->_vptr_MemoryManager[4])(manager,targetStr);
          lVar6 = (long)iVar3;
          bVar1 = XMLString::isDigit(addrString[lVar6 + 1]);
          if (bVar1) {
            return false;
          }
        }
        else {
          lVar6 = (long)iVar3;
        }
        bVar1 = XMLString::isDigit(addrString[lVar6 + 1]);
        if (bVar1) {
          bVar1 = isWellFormedIPv4Address(addrString,length);
          return bVar1;
        }
        uVar5 = 0;
        if (0xff < length) {
          return false;
        }
        uVar7 = 1;
        do {
          bVar1 = uVar7 - length == 1;
          if (bVar1) {
            return bVar1;
          }
          if (addrString[uVar7 - 1] == L'.') {
            if ((uVar7 != 1) && (bVar2 = XMLString::isAlphaNum(addrString[uVar7 - 2]), !bVar2)) {
              return bVar1;
            }
            uVar5 = 0;
            if ((uVar7 < length) &&
               (bVar2 = XMLString::isAlphaNum(addrString[uVar7]), uVar5 = 0, !bVar2)) {
              return bVar1;
            }
          }
          else {
            bVar2 = XMLString::isAlphaNum(addrString[uVar7 - 1]);
            if ((!bVar2) && (addrString[uVar7 - 1] != L'-')) {
              return bVar1;
            }
            uVar5 = uVar5 + 1;
            if (0x3f < uVar5) {
              return bVar1;
            }
          }
          uVar7 = uVar7 + 1;
        } while( true );
      }
    }
  }
  return false;
}

Assistant:

bool XMLUri::isWellFormedAddress(const XMLCh* const addrString
                                 , MemoryManager* const manager)
{
    // Check that we have a non-zero length string.
    if (!addrString || !*addrString)
        return false;

    // Get address length.
    XMLSize_t addrStrLen = XMLString::stringLen(addrString);

    // Check if the host is a valid IPv6reference.
    if (*addrString == chOpenSquare)
    {
        return isWellFormedIPv6Reference(addrString, addrStrLen);
    }

    //
    // Cannot start with a '.', '-', or end with a '-'.
    //
    if (*addrString == chPeriod ||
        *addrString == chDash ||
        addrString[addrStrLen-1] == chDash)
        return false;

    // rightmost domain label starting with digit indicates IP address
    // since top level domain label can only start with an alpha
    // see RFC 2396 Section 3.2.2

    int lastPeriodPos = XMLString::lastIndexOf(addrString, chPeriod);

    // if the string ends with "."
    // get the second last "."
    if (XMLSize_t(lastPeriodPos + 1) == addrStrLen)
    {
        XMLCh* tmp2 = (XMLCh*) manager->allocate
        (
            addrStrLen * sizeof(XMLCh)
        );//new XMLCh[addrStrLen];
        XMLString::subString(tmp2, addrString, 0, lastPeriodPos, manager);
        lastPeriodPos = XMLString::lastIndexOf(tmp2, chPeriod);
        manager->deallocate(tmp2);//delete [] tmp2;

        if ( XMLString::isDigit(addrString[lastPeriodPos + 1]))
			return false;
    }

    if (XMLString::isDigit(addrString[lastPeriodPos + 1]))
    {
        return isWellFormedIPv4Address(addrString, addrStrLen);
    } // end of IPv4address
    else
    {
        //
        //  hostname      = *( domainlabel "." ) toplabel [ "." ]
        //  domainlabel   = alphanum | alphanum *( alphanum | "-" ) alphanum
        //  toplabel      = alpha | alpha *( alphanum | "-" ) alphanum

        // RFC 2396 states that hostnames take the form described in
        // RFC 1034 (Section 3) and RFC 1123 (Section 2.1). According
        // to RFC 1034, hostnames are limited to 255 characters.
        if (addrStrLen > 255) {
            return false;
        }

        unsigned int labelCharCount = 0;

        // domain labels can contain alphanumerics and '-"
        // but must start and end with an alphanumeric
        for (XMLSize_t i = 0; i < addrStrLen; i++)
        {
            if (addrString[i] == chPeriod)
            {
              if (((i > 0)  &&
                   (!XMLString::isAlphaNum(addrString[i-1]))) ||
                  ((i + 1 < addrStrLen) &&
                   (!XMLString::isAlphaNum(addrString[i+1])))  )
                {
                    return false;
                }
                labelCharCount = 0;
            }
            else if (!XMLString::isAlphaNum(addrString[i]) &&
                      addrString[i] != chDash)
            {
                return false;
            }
            // RFC 1034: Labels must be 63 characters or less.
            else if (++labelCharCount > 63) {
                return false;
            }
        } //for
    }

    return true;
}